

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
GetProperty_Internal<true>
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  uint32 index;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  RecyclableObject *pRVar6;
  int local_54;
  SimpleDictionaryPropertyDescriptor<int> *pSStack_50;
  int i;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  Var local_38;
  
  propertyRecord = (PropertyRecord *)info;
  local_38 = originalInstance;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x492,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,
                     &stack0xffffffffffffffb0,&local_54);
  if (bVar2) {
    BVar3 = 0;
    if ((pSStack_50->Attributes & 8) == 0) {
      if (pSStack_50->propertyIndex == -1) {
        *value = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
        BVar3 = 1;
      }
      else {
        pvVar5 = DynamicObject::GetSlot(instance,pSStack_50->propertyIndex);
        *value = pvVar5;
        if (propertyRecord != (PropertyRecord *)0x0) {
          (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject = (_func_int **)instance;
          propertyRecord->pid = 0xffff;
        }
        BVar3 = 1;
        if ((propertyRecord != (PropertyRecord *)0x0) && (((ulong)*pSStack_50 & 6) != 2)) {
          *(byte *)&propertyRecord->hash = (byte)propertyRecord->hash & 0xfb;
        }
      }
    }
  }
  else {
    bVar2 = DynamicObject::HasObjectArray(instance);
    if ((bVar2) && (*(char *)(descriptor + 2) == '\x01')) {
      index = PropertyRecord::GetNumericValue((PropertyRecord *)descriptor);
      BVar3 = DynamicTypeHandler::GetItem
                        (&this->super_DynamicTypeHandler,instance,local_38,index,value,
                         requestContext);
    }
    else {
      pRVar6 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar6;
      BVar3 = 0;
    }
  }
  return BVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetProperty_Internal(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return GetPropertyFromDescriptor<allowLetConstGlobal>(instance, descriptor, value, info);
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetItem(instance, originalInstance, propertyRecord->GetNumericValue(), value, requestContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }